

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O2

anon_class_72_5_b506d461 * __thiscall
qclab::qgates::lambda_QGate1<std::complex<double>>
          (anon_class_72_5_b506d461 *__return_storage_ptr__,qgates *this,Op op,
          SquareMatrix<std::complex<double>_> *mat1,complex<double> *vector)

{
  complex<double> *pcVar1;
  long lVar2;
  undefined8 uVar3;
  undefined7 in_register_00000011;
  SquareMatrix<std::complex<double>_> *A;
  
  A = (SquareMatrix<std::complex<double>_> *)CONCAT71(in_register_00000011,op);
  if (A->size_ == 2) {
    dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>((Op)this,A);
    pcVar1 = (A->data_)._M_t.
             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
    uVar3 = *(undefined8 *)(pcVar1->_M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m11)._M_value = *(undefined8 *)pcVar1->_M_value;
    *(undefined8 *)((__return_storage_ptr__->m11)._M_value + 8) = uVar3;
    lVar2 = A->size_;
    uVar3 = *(undefined8 *)(pcVar1[lVar2]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m12)._M_value = *(undefined8 *)pcVar1[lVar2]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m12)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)(pcVar1[1]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m21)._M_value = *(undefined8 *)pcVar1[1]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m21)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)((long)pcVar1[lVar2 + 1]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m22)._M_value =
         *(undefined8 *)pcVar1[lVar2 + 1]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m22)._M_value + 8) = uVar3;
    __return_storage_ptr__->vector = (complex<double> *)mat1;
    return __return_storage_ptr__;
  }
  __assert_fail("mat1.size() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/src/qgates/apply.hpp"
                ,0xd,
                "auto qclab::qgates::lambda_QGate1(Op, qclab::dense::SquareMatrix<T>, T *) [T = std::complex<double>]"
               );
}

Assistant:

auto lambda_QGate1( Op op , qclab::dense::SquareMatrix< T > mat1 ,
                      T* vector ) {
    assert( mat1.size() == 2 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat1 ) ;
    const T m11 = mat1( 0 , 0 ) ; const T m12 = mat1( 0 , 1 ) ;
    const T m21 = mat1( 1 , 0 ) ; const T m22 = mat1( 1 , 1 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      vector[a] = m11 * x1 + m12 * x2 ;
      vector[b] = m21 * x1 + m22 * x2 ;
    } ;
    return f ;
  }